

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

double ipx::PrimalInfeasibility(Model *model,Vector *x)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  for (sVar1 = 0; x->_M_size != sVar1; sVar1 = sVar1 + 1) {
    dVar3 = (model->lb_)._M_data[sVar1] - x->_M_data[sVar1];
    dVar4 = x->_M_data[sVar1] - (model->ub_)._M_data[sVar1];
    if (dVar3 <= dVar2) {
      dVar3 = dVar2;
    }
    dVar2 = dVar4;
    if (dVar4 <= dVar3) {
      dVar2 = dVar3;
    }
  }
  return dVar2;
}

Assistant:

double PrimalInfeasibility(const Model& model, const Vector& x) {
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    assert(x.size() == lb.size());

    double infeas = 0.0;
    for (size_t j = 0; j < x.size(); j++) {
        infeas = std::max(infeas, lb[j]-x[j]);
        infeas = std::max(infeas, x[j]-ub[j]);
    }
    return infeas;
}